

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CField *stm)

{
  CType *type;
  bool bVar1;
  CError *this_00;
  CError CStack_68;
  string errorMessage;
  
  this_00 = &CStack_68;
  std::operator<<((ostream *)&std::cout,"typechecker: field\n");
  if (((stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
       super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
       super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl == (CIdExp *)0x0) ||
     (type = (stm->type)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
             super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
             super__Head_base<0UL,_CType_*,_false>._M_head_impl, type == (CType *)0x0)) {
    CError::CError(&CStack_68,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>(&this->errors,&CStack_68);
  }
  else {
    bVar1 = checkTypeExisting(this,type);
    if (bVar1) {
      TypeInfo::TypeInfo((TypeInfo *)&CStack_68,VOID);
      TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)&CStack_68);
      this_00 = (CError *)&CStack_68.message._M_string_length;
    }
    else {
      CType::toString_abi_cxx11_
                (&CStack_68.message,
                 (stm->type)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                 super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                 super__Head_base<0UL,_CType_*,_false>._M_head_impl);
      CError::GetUndeclaredErrorMessage(&errorMessage,&CStack_68.message);
      std::__cxx11::string::~string((string *)&CStack_68);
      CError::CError(&CStack_68,&errorMessage,
                     (PositionInfo *)
                     ((long)&(((stm->type)._M_t.
                               super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
                               super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                               super__Head_base<0UL,_CType_*,_false>._M_head_impl)->super_IWrapper).
                             super_PositionedNode + 8));
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>(&this->errors,&CStack_68);
      std::__cxx11::string::~string((string *)&CStack_68);
      this_00 = (CError *)&errorMessage;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CField &stm ) 
{
	std::cout << "typechecker: field\n";
    if( stm.id && stm.type ) {
        bool isVisibleType = checkTypeExisting(*stm.type);
        if( !isVisibleType ) {
            auto errorMessage = CError::GetUndeclaredErrorMessage( stm.type->toString() );
            errors.push_back( CError( errorMessage, stm.type->position ) );
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}